

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_utils.h
# Opt level: O0

void transpose16x16_sse2(__m128i *x,__m128i *d)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 *in_RSI;
  undefined8 *in_RDI;
  __m128i w7;
  __m128i w6;
  __m128i w5;
  __m128i w4;
  __m128i w3;
  __m128i w2;
  __m128i w1;
  __m128i w0;
  undefined1 local_708;
  undefined1 uStack_707;
  undefined1 uStack_706;
  undefined1 uStack_705;
  undefined1 uStack_704;
  undefined1 uStack_703;
  undefined1 uStack_702;
  undefined1 uStack_701;
  undefined1 local_6f8;
  undefined1 uStack_6f7;
  undefined1 uStack_6f6;
  undefined1 uStack_6f5;
  undefined1 uStack_6f4;
  undefined1 uStack_6f3;
  undefined1 uStack_6f2;
  undefined1 uStack_6f1;
  undefined1 local_6e8;
  undefined1 uStack_6e7;
  undefined1 uStack_6e6;
  undefined1 uStack_6e5;
  undefined1 uStack_6e4;
  undefined1 uStack_6e3;
  undefined1 uStack_6e2;
  undefined1 uStack_6e1;
  undefined1 local_6d8;
  undefined1 uStack_6d7;
  undefined1 uStack_6d6;
  undefined1 uStack_6d5;
  undefined1 uStack_6d4;
  undefined1 uStack_6d3;
  undefined1 uStack_6d2;
  undefined1 uStack_6d1;
  undefined1 local_6c8;
  undefined1 uStack_6c7;
  undefined1 uStack_6c6;
  undefined1 uStack_6c5;
  undefined1 uStack_6c4;
  undefined1 uStack_6c3;
  undefined1 uStack_6c2;
  undefined1 uStack_6c1;
  undefined1 local_6b8;
  undefined1 uStack_6b7;
  undefined1 uStack_6b6;
  undefined1 uStack_6b5;
  undefined1 uStack_6b4;
  undefined1 uStack_6b3;
  undefined1 uStack_6b2;
  undefined1 uStack_6b1;
  undefined1 local_6a8;
  undefined1 uStack_6a7;
  undefined1 uStack_6a6;
  undefined1 uStack_6a5;
  undefined1 uStack_6a4;
  undefined1 uStack_6a3;
  undefined1 uStack_6a2;
  undefined1 uStack_6a1;
  undefined1 local_698;
  undefined1 uStack_697;
  undefined1 uStack_696;
  undefined1 uStack_695;
  undefined1 uStack_694;
  undefined1 uStack_693;
  undefined1 uStack_692;
  undefined1 uStack_691;
  undefined1 local_688;
  undefined1 uStack_687;
  undefined1 uStack_686;
  undefined1 uStack_685;
  undefined1 uStack_684;
  undefined1 uStack_683;
  undefined1 uStack_682;
  undefined1 uStack_681;
  undefined1 local_678;
  undefined1 uStack_677;
  undefined1 uStack_676;
  undefined1 uStack_675;
  undefined1 uStack_674;
  undefined1 uStack_673;
  undefined1 uStack_672;
  undefined1 uStack_671;
  undefined1 local_668;
  undefined1 uStack_667;
  undefined1 uStack_666;
  undefined1 uStack_665;
  undefined1 uStack_664;
  undefined1 uStack_663;
  undefined1 uStack_662;
  undefined1 uStack_661;
  undefined1 local_658;
  undefined1 uStack_657;
  undefined1 uStack_656;
  undefined1 uStack_655;
  undefined1 uStack_654;
  undefined1 uStack_653;
  undefined1 uStack_652;
  undefined1 uStack_651;
  undefined1 local_648;
  undefined1 uStack_647;
  undefined1 uStack_646;
  undefined1 uStack_645;
  undefined1 uStack_644;
  undefined1 uStack_643;
  undefined1 uStack_642;
  undefined1 uStack_641;
  undefined1 local_638;
  undefined1 uStack_637;
  undefined1 uStack_636;
  undefined1 uStack_635;
  undefined1 uStack_634;
  undefined1 uStack_633;
  undefined1 uStack_632;
  undefined1 uStack_631;
  undefined1 local_628;
  undefined1 uStack_627;
  undefined1 uStack_626;
  undefined1 uStack_625;
  undefined1 uStack_624;
  undefined1 uStack_623;
  undefined1 uStack_622;
  undefined1 uStack_621;
  undefined1 local_618;
  undefined1 uStack_617;
  undefined1 uStack_616;
  undefined1 uStack_615;
  undefined1 uStack_614;
  undefined1 uStack_613;
  undefined1 uStack_612;
  undefined1 uStack_611;
  undefined1 uStack_100;
  undefined1 uStack_ff;
  undefined1 uStack_fe;
  undefined1 uStack_fd;
  undefined1 uStack_fc;
  undefined1 uStack_fb;
  undefined1 uStack_fa;
  undefined1 uStack_f9;
  undefined1 uStack_f0;
  undefined1 uStack_ef;
  undefined1 uStack_ee;
  undefined1 uStack_ed;
  undefined1 uStack_ec;
  undefined1 uStack_eb;
  undefined1 uStack_ea;
  undefined1 uStack_e9;
  undefined1 uStack_e0;
  undefined1 uStack_df;
  undefined1 uStack_de;
  undefined1 uStack_dd;
  undefined1 uStack_dc;
  undefined1 uStack_db;
  undefined1 uStack_da;
  undefined1 uStack_d9;
  undefined1 uStack_d0;
  undefined1 uStack_cf;
  undefined1 uStack_ce;
  undefined1 uStack_cd;
  undefined1 uStack_cc;
  undefined1 uStack_cb;
  undefined1 uStack_ca;
  undefined1 uStack_c9;
  undefined1 uStack_c0;
  undefined1 uStack_bf;
  undefined1 uStack_be;
  undefined1 uStack_bd;
  undefined1 uStack_bc;
  undefined1 uStack_bb;
  undefined1 uStack_ba;
  undefined1 uStack_b9;
  undefined1 uStack_b0;
  undefined1 uStack_af;
  undefined1 uStack_ae;
  undefined1 uStack_ad;
  undefined1 uStack_ac;
  undefined1 uStack_ab;
  undefined1 uStack_aa;
  undefined1 uStack_a9;
  undefined1 uStack_a0;
  undefined1 uStack_9f;
  undefined1 uStack_9e;
  undefined1 uStack_9d;
  undefined1 uStack_9c;
  undefined1 uStack_9b;
  undefined1 uStack_9a;
  undefined1 uStack_99;
  undefined1 uStack_90;
  undefined1 uStack_8f;
  undefined1 uStack_8e;
  undefined1 uStack_8d;
  undefined1 uStack_8c;
  undefined1 uStack_8b;
  undefined1 uStack_8a;
  undefined1 uStack_89;
  __m128i w15;
  __m128i w14;
  __m128i w13;
  __m128i w12;
  __m128i w11;
  __m128i w10;
  __m128i w9;
  __m128i w8;
  
  uVar1 = *in_RDI;
  uVar2 = in_RDI[2];
  local_618 = (undefined1)uVar1;
  uStack_617 = (undefined1)((ulong)uVar1 >> 8);
  uStack_616 = (undefined1)((ulong)uVar1 >> 0x10);
  uStack_615 = (undefined1)((ulong)uVar1 >> 0x18);
  uStack_614 = (undefined1)((ulong)uVar1 >> 0x20);
  uStack_613 = (undefined1)((ulong)uVar1 >> 0x28);
  uStack_612 = (undefined1)((ulong)uVar1 >> 0x30);
  uStack_611 = (undefined1)((ulong)uVar1 >> 0x38);
  local_628 = (undefined1)uVar2;
  uStack_627 = (undefined1)((ulong)uVar2 >> 8);
  uStack_626 = (undefined1)((ulong)uVar2 >> 0x10);
  uStack_625 = (undefined1)((ulong)uVar2 >> 0x18);
  uStack_624 = (undefined1)((ulong)uVar2 >> 0x20);
  uStack_623 = (undefined1)((ulong)uVar2 >> 0x28);
  uStack_622 = (undefined1)((ulong)uVar2 >> 0x30);
  uStack_621 = (undefined1)((ulong)uVar2 >> 0x38);
  uVar1 = in_RDI[4];
  uVar2 = in_RDI[6];
  local_638 = (undefined1)uVar1;
  uStack_637 = (undefined1)((ulong)uVar1 >> 8);
  uStack_636 = (undefined1)((ulong)uVar1 >> 0x10);
  uStack_635 = (undefined1)((ulong)uVar1 >> 0x18);
  uStack_634 = (undefined1)((ulong)uVar1 >> 0x20);
  uStack_633 = (undefined1)((ulong)uVar1 >> 0x28);
  uStack_632 = (undefined1)((ulong)uVar1 >> 0x30);
  uStack_631 = (undefined1)((ulong)uVar1 >> 0x38);
  local_648 = (undefined1)uVar2;
  uStack_647 = (undefined1)((ulong)uVar2 >> 8);
  uStack_646 = (undefined1)((ulong)uVar2 >> 0x10);
  uStack_645 = (undefined1)((ulong)uVar2 >> 0x18);
  uStack_644 = (undefined1)((ulong)uVar2 >> 0x20);
  uStack_643 = (undefined1)((ulong)uVar2 >> 0x28);
  uStack_642 = (undefined1)((ulong)uVar2 >> 0x30);
  uStack_641 = (undefined1)((ulong)uVar2 >> 0x38);
  uVar1 = in_RDI[8];
  uVar2 = in_RDI[10];
  local_658 = (undefined1)uVar1;
  uStack_657 = (undefined1)((ulong)uVar1 >> 8);
  uStack_656 = (undefined1)((ulong)uVar1 >> 0x10);
  uStack_655 = (undefined1)((ulong)uVar1 >> 0x18);
  uStack_654 = (undefined1)((ulong)uVar1 >> 0x20);
  uStack_653 = (undefined1)((ulong)uVar1 >> 0x28);
  uStack_652 = (undefined1)((ulong)uVar1 >> 0x30);
  uStack_651 = (undefined1)((ulong)uVar1 >> 0x38);
  local_668 = (undefined1)uVar2;
  uStack_667 = (undefined1)((ulong)uVar2 >> 8);
  uStack_666 = (undefined1)((ulong)uVar2 >> 0x10);
  uStack_665 = (undefined1)((ulong)uVar2 >> 0x18);
  uStack_664 = (undefined1)((ulong)uVar2 >> 0x20);
  uStack_663 = (undefined1)((ulong)uVar2 >> 0x28);
  uStack_662 = (undefined1)((ulong)uVar2 >> 0x30);
  uStack_661 = (undefined1)((ulong)uVar2 >> 0x38);
  uVar1 = in_RDI[0xc];
  uVar2 = in_RDI[0xe];
  local_678 = (undefined1)uVar1;
  uStack_677 = (undefined1)((ulong)uVar1 >> 8);
  uStack_676 = (undefined1)((ulong)uVar1 >> 0x10);
  uStack_675 = (undefined1)((ulong)uVar1 >> 0x18);
  uStack_674 = (undefined1)((ulong)uVar1 >> 0x20);
  uStack_673 = (undefined1)((ulong)uVar1 >> 0x28);
  uStack_672 = (undefined1)((ulong)uVar1 >> 0x30);
  uStack_671 = (undefined1)((ulong)uVar1 >> 0x38);
  local_688 = (undefined1)uVar2;
  uStack_687 = (undefined1)((ulong)uVar2 >> 8);
  uStack_686 = (undefined1)((ulong)uVar2 >> 0x10);
  uStack_685 = (undefined1)((ulong)uVar2 >> 0x18);
  uStack_684 = (undefined1)((ulong)uVar2 >> 0x20);
  uStack_683 = (undefined1)((ulong)uVar2 >> 0x28);
  uStack_682 = (undefined1)((ulong)uVar2 >> 0x30);
  uStack_681 = (undefined1)((ulong)uVar2 >> 0x38);
  uVar1 = in_RDI[0x10];
  uVar2 = in_RDI[0x12];
  local_698 = (undefined1)uVar1;
  uStack_697 = (undefined1)((ulong)uVar1 >> 8);
  uStack_696 = (undefined1)((ulong)uVar1 >> 0x10);
  uStack_695 = (undefined1)((ulong)uVar1 >> 0x18);
  uStack_694 = (undefined1)((ulong)uVar1 >> 0x20);
  uStack_693 = (undefined1)((ulong)uVar1 >> 0x28);
  uStack_692 = (undefined1)((ulong)uVar1 >> 0x30);
  uStack_691 = (undefined1)((ulong)uVar1 >> 0x38);
  local_6a8 = (undefined1)uVar2;
  uStack_6a7 = (undefined1)((ulong)uVar2 >> 8);
  uStack_6a6 = (undefined1)((ulong)uVar2 >> 0x10);
  uStack_6a5 = (undefined1)((ulong)uVar2 >> 0x18);
  uStack_6a4 = (undefined1)((ulong)uVar2 >> 0x20);
  uStack_6a3 = (undefined1)((ulong)uVar2 >> 0x28);
  uStack_6a2 = (undefined1)((ulong)uVar2 >> 0x30);
  uStack_6a1 = (undefined1)((ulong)uVar2 >> 0x38);
  uVar1 = in_RDI[0x14];
  uVar2 = in_RDI[0x16];
  local_6b8 = (undefined1)uVar1;
  uStack_6b7 = (undefined1)((ulong)uVar1 >> 8);
  uStack_6b6 = (undefined1)((ulong)uVar1 >> 0x10);
  uStack_6b5 = (undefined1)((ulong)uVar1 >> 0x18);
  uStack_6b4 = (undefined1)((ulong)uVar1 >> 0x20);
  uStack_6b3 = (undefined1)((ulong)uVar1 >> 0x28);
  uStack_6b2 = (undefined1)((ulong)uVar1 >> 0x30);
  uStack_6b1 = (undefined1)((ulong)uVar1 >> 0x38);
  local_6c8 = (undefined1)uVar2;
  uStack_6c7 = (undefined1)((ulong)uVar2 >> 8);
  uStack_6c6 = (undefined1)((ulong)uVar2 >> 0x10);
  uStack_6c5 = (undefined1)((ulong)uVar2 >> 0x18);
  uStack_6c4 = (undefined1)((ulong)uVar2 >> 0x20);
  uStack_6c3 = (undefined1)((ulong)uVar2 >> 0x28);
  uStack_6c2 = (undefined1)((ulong)uVar2 >> 0x30);
  uStack_6c1 = (undefined1)((ulong)uVar2 >> 0x38);
  uVar1 = in_RDI[0x18];
  uVar2 = in_RDI[0x1a];
  local_6d8 = (undefined1)uVar1;
  uStack_6d7 = (undefined1)((ulong)uVar1 >> 8);
  uStack_6d6 = (undefined1)((ulong)uVar1 >> 0x10);
  uStack_6d5 = (undefined1)((ulong)uVar1 >> 0x18);
  uStack_6d4 = (undefined1)((ulong)uVar1 >> 0x20);
  uStack_6d3 = (undefined1)((ulong)uVar1 >> 0x28);
  uStack_6d2 = (undefined1)((ulong)uVar1 >> 0x30);
  uStack_6d1 = (undefined1)((ulong)uVar1 >> 0x38);
  local_6e8 = (undefined1)uVar2;
  uStack_6e7 = (undefined1)((ulong)uVar2 >> 8);
  uStack_6e6 = (undefined1)((ulong)uVar2 >> 0x10);
  uStack_6e5 = (undefined1)((ulong)uVar2 >> 0x18);
  uStack_6e4 = (undefined1)((ulong)uVar2 >> 0x20);
  uStack_6e3 = (undefined1)((ulong)uVar2 >> 0x28);
  uStack_6e2 = (undefined1)((ulong)uVar2 >> 0x30);
  uStack_6e1 = (undefined1)((ulong)uVar2 >> 0x38);
  uVar1 = in_RDI[0x1c];
  uVar2 = in_RDI[0x1e];
  local_6f8 = (undefined1)uVar1;
  uStack_6f7 = (undefined1)((ulong)uVar1 >> 8);
  uStack_6f6 = (undefined1)((ulong)uVar1 >> 0x10);
  uStack_6f5 = (undefined1)((ulong)uVar1 >> 0x18);
  uStack_6f4 = (undefined1)((ulong)uVar1 >> 0x20);
  uStack_6f3 = (undefined1)((ulong)uVar1 >> 0x28);
  uStack_6f2 = (undefined1)((ulong)uVar1 >> 0x30);
  uStack_6f1 = (undefined1)((ulong)uVar1 >> 0x38);
  local_708 = (undefined1)uVar2;
  uStack_707 = (undefined1)((ulong)uVar2 >> 8);
  uStack_706 = (undefined1)((ulong)uVar2 >> 0x10);
  uStack_705 = (undefined1)((ulong)uVar2 >> 0x18);
  uStack_704 = (undefined1)((ulong)uVar2 >> 0x20);
  uStack_703 = (undefined1)((ulong)uVar2 >> 0x28);
  uStack_702 = (undefined1)((ulong)uVar2 >> 0x30);
  uStack_701 = (undefined1)((ulong)uVar2 >> 0x38);
  *in_RSI = local_618;
  in_RSI[1] = local_628;
  in_RSI[2] = local_638;
  in_RSI[3] = local_648;
  in_RSI[4] = local_658;
  in_RSI[5] = local_668;
  in_RSI[6] = local_678;
  in_RSI[7] = local_688;
  in_RSI[8] = local_698;
  in_RSI[9] = local_6a8;
  in_RSI[10] = local_6b8;
  in_RSI[0xb] = local_6c8;
  in_RSI[0xc] = local_6d8;
  in_RSI[0xd] = local_6e8;
  in_RSI[0xe] = local_6f8;
  in_RSI[0xf] = local_708;
  in_RSI[0x10] = uStack_617;
  in_RSI[0x11] = uStack_627;
  in_RSI[0x12] = uStack_637;
  in_RSI[0x13] = uStack_647;
  in_RSI[0x14] = uStack_657;
  in_RSI[0x15] = uStack_667;
  in_RSI[0x16] = uStack_677;
  in_RSI[0x17] = uStack_687;
  in_RSI[0x18] = uStack_697;
  in_RSI[0x19] = uStack_6a7;
  in_RSI[0x1a] = uStack_6b7;
  in_RSI[0x1b] = uStack_6c7;
  in_RSI[0x1c] = uStack_6d7;
  in_RSI[0x1d] = uStack_6e7;
  in_RSI[0x1e] = uStack_6f7;
  in_RSI[0x1f] = uStack_707;
  in_RSI[0x20] = uStack_616;
  in_RSI[0x21] = uStack_626;
  in_RSI[0x22] = uStack_636;
  in_RSI[0x23] = uStack_646;
  in_RSI[0x24] = uStack_656;
  in_RSI[0x25] = uStack_666;
  in_RSI[0x26] = uStack_676;
  in_RSI[0x27] = uStack_686;
  in_RSI[0x28] = uStack_696;
  in_RSI[0x29] = uStack_6a6;
  in_RSI[0x2a] = uStack_6b6;
  in_RSI[0x2b] = uStack_6c6;
  in_RSI[0x2c] = uStack_6d6;
  in_RSI[0x2d] = uStack_6e6;
  in_RSI[0x2e] = uStack_6f6;
  in_RSI[0x2f] = uStack_706;
  in_RSI[0x30] = uStack_615;
  in_RSI[0x31] = uStack_625;
  in_RSI[0x32] = uStack_635;
  in_RSI[0x33] = uStack_645;
  in_RSI[0x34] = uStack_655;
  in_RSI[0x35] = uStack_665;
  in_RSI[0x36] = uStack_675;
  in_RSI[0x37] = uStack_685;
  in_RSI[0x38] = uStack_695;
  in_RSI[0x39] = uStack_6a5;
  in_RSI[0x3a] = uStack_6b5;
  in_RSI[0x3b] = uStack_6c5;
  in_RSI[0x3c] = uStack_6d5;
  in_RSI[0x3d] = uStack_6e5;
  in_RSI[0x3e] = uStack_6f5;
  in_RSI[0x3f] = uStack_705;
  in_RSI[0x40] = uStack_614;
  in_RSI[0x41] = uStack_624;
  in_RSI[0x42] = uStack_634;
  in_RSI[0x43] = uStack_644;
  in_RSI[0x44] = uStack_654;
  in_RSI[0x45] = uStack_664;
  in_RSI[0x46] = uStack_674;
  in_RSI[0x47] = uStack_684;
  in_RSI[0x48] = uStack_694;
  in_RSI[0x49] = uStack_6a4;
  in_RSI[0x4a] = uStack_6b4;
  in_RSI[0x4b] = uStack_6c4;
  in_RSI[0x4c] = uStack_6d4;
  in_RSI[0x4d] = uStack_6e4;
  in_RSI[0x4e] = uStack_6f4;
  in_RSI[0x4f] = uStack_704;
  in_RSI[0x50] = uStack_613;
  in_RSI[0x51] = uStack_623;
  in_RSI[0x52] = uStack_633;
  in_RSI[0x53] = uStack_643;
  in_RSI[0x54] = uStack_653;
  in_RSI[0x55] = uStack_663;
  in_RSI[0x56] = uStack_673;
  in_RSI[0x57] = uStack_683;
  in_RSI[0x58] = uStack_693;
  in_RSI[0x59] = uStack_6a3;
  in_RSI[0x5a] = uStack_6b3;
  in_RSI[0x5b] = uStack_6c3;
  in_RSI[0x5c] = uStack_6d3;
  in_RSI[0x5d] = uStack_6e3;
  in_RSI[0x5e] = uStack_6f3;
  in_RSI[0x5f] = uStack_703;
  in_RSI[0x60] = uStack_612;
  in_RSI[0x61] = uStack_622;
  in_RSI[0x62] = uStack_632;
  in_RSI[99] = uStack_642;
  in_RSI[100] = uStack_652;
  in_RSI[0x65] = uStack_662;
  in_RSI[0x66] = uStack_672;
  in_RSI[0x67] = uStack_682;
  in_RSI[0x68] = uStack_692;
  in_RSI[0x69] = uStack_6a2;
  in_RSI[0x6a] = uStack_6b2;
  in_RSI[0x6b] = uStack_6c2;
  in_RSI[0x6c] = uStack_6d2;
  in_RSI[0x6d] = uStack_6e2;
  in_RSI[0x6e] = uStack_6f2;
  in_RSI[0x6f] = uStack_702;
  in_RSI[0x70] = uStack_611;
  in_RSI[0x71] = uStack_621;
  in_RSI[0x72] = uStack_631;
  in_RSI[0x73] = uStack_641;
  in_RSI[0x74] = uStack_651;
  in_RSI[0x75] = uStack_661;
  in_RSI[0x76] = uStack_671;
  in_RSI[0x77] = uStack_681;
  in_RSI[0x78] = uStack_691;
  in_RSI[0x79] = uStack_6a1;
  in_RSI[0x7a] = uStack_6b1;
  in_RSI[0x7b] = uStack_6c1;
  in_RSI[0x7c] = uStack_6d1;
  in_RSI[0x7d] = uStack_6e1;
  in_RSI[0x7e] = uStack_6f1;
  in_RSI[0x7f] = uStack_701;
  uVar1 = in_RDI[1];
  uVar2 = in_RDI[3];
  w8[0]._0_1_ = (undefined1)uVar1;
  w8[0]._1_1_ = (undefined1)((ulong)uVar1 >> 8);
  w8[0]._2_1_ = (undefined1)((ulong)uVar1 >> 0x10);
  w8[0]._3_1_ = (undefined1)((ulong)uVar1 >> 0x18);
  w8[0]._4_1_ = (undefined1)((ulong)uVar1 >> 0x20);
  w8[0]._5_1_ = (undefined1)((ulong)uVar1 >> 0x28);
  w8[0]._6_1_ = (undefined1)((ulong)uVar1 >> 0x30);
  w8[0]._7_1_ = (undefined1)((ulong)uVar1 >> 0x38);
  w9[0]._0_1_ = (undefined1)uVar2;
  w9[0]._1_1_ = (undefined1)((ulong)uVar2 >> 8);
  w9[0]._2_1_ = (undefined1)((ulong)uVar2 >> 0x10);
  w9[0]._3_1_ = (undefined1)((ulong)uVar2 >> 0x18);
  w9[0]._4_1_ = (undefined1)((ulong)uVar2 >> 0x20);
  w9[0]._5_1_ = (undefined1)((ulong)uVar2 >> 0x28);
  w9[0]._6_1_ = (undefined1)((ulong)uVar2 >> 0x30);
  w9[0]._7_1_ = (undefined1)((ulong)uVar2 >> 0x38);
  uVar1 = in_RDI[5];
  uVar2 = in_RDI[7];
  w10[0]._0_1_ = (undefined1)uVar1;
  w10[0]._1_1_ = (undefined1)((ulong)uVar1 >> 8);
  w10[0]._2_1_ = (undefined1)((ulong)uVar1 >> 0x10);
  w10[0]._3_1_ = (undefined1)((ulong)uVar1 >> 0x18);
  w10[0]._4_1_ = (undefined1)((ulong)uVar1 >> 0x20);
  w10[0]._5_1_ = (undefined1)((ulong)uVar1 >> 0x28);
  w10[0]._6_1_ = (undefined1)((ulong)uVar1 >> 0x30);
  w10[0]._7_1_ = (undefined1)((ulong)uVar1 >> 0x38);
  w11[0]._0_1_ = (undefined1)uVar2;
  w11[0]._1_1_ = (undefined1)((ulong)uVar2 >> 8);
  w11[0]._2_1_ = (undefined1)((ulong)uVar2 >> 0x10);
  w11[0]._3_1_ = (undefined1)((ulong)uVar2 >> 0x18);
  w11[0]._4_1_ = (undefined1)((ulong)uVar2 >> 0x20);
  w11[0]._5_1_ = (undefined1)((ulong)uVar2 >> 0x28);
  w11[0]._6_1_ = (undefined1)((ulong)uVar2 >> 0x30);
  w11[0]._7_1_ = (undefined1)((ulong)uVar2 >> 0x38);
  uVar1 = in_RDI[9];
  uVar2 = in_RDI[0xb];
  w12[0]._0_1_ = (undefined1)uVar1;
  w12[0]._1_1_ = (undefined1)((ulong)uVar1 >> 8);
  w12[0]._2_1_ = (undefined1)((ulong)uVar1 >> 0x10);
  w12[0]._3_1_ = (undefined1)((ulong)uVar1 >> 0x18);
  w12[0]._4_1_ = (undefined1)((ulong)uVar1 >> 0x20);
  w12[0]._5_1_ = (undefined1)((ulong)uVar1 >> 0x28);
  w12[0]._6_1_ = (undefined1)((ulong)uVar1 >> 0x30);
  w12[0]._7_1_ = (undefined1)((ulong)uVar1 >> 0x38);
  w13[0]._0_1_ = (undefined1)uVar2;
  w13[0]._1_1_ = (undefined1)((ulong)uVar2 >> 8);
  w13[0]._2_1_ = (undefined1)((ulong)uVar2 >> 0x10);
  w13[0]._3_1_ = (undefined1)((ulong)uVar2 >> 0x18);
  w13[0]._4_1_ = (undefined1)((ulong)uVar2 >> 0x20);
  w13[0]._5_1_ = (undefined1)((ulong)uVar2 >> 0x28);
  w13[0]._6_1_ = (undefined1)((ulong)uVar2 >> 0x30);
  w13[0]._7_1_ = (undefined1)((ulong)uVar2 >> 0x38);
  uVar1 = in_RDI[0xd];
  uVar2 = in_RDI[0xf];
  w14[0]._0_1_ = (undefined1)uVar1;
  w14[0]._1_1_ = (undefined1)((ulong)uVar1 >> 8);
  w14[0]._2_1_ = (undefined1)((ulong)uVar1 >> 0x10);
  w14[0]._3_1_ = (undefined1)((ulong)uVar1 >> 0x18);
  w14[0]._4_1_ = (undefined1)((ulong)uVar1 >> 0x20);
  w14[0]._5_1_ = (undefined1)((ulong)uVar1 >> 0x28);
  w14[0]._6_1_ = (undefined1)((ulong)uVar1 >> 0x30);
  w14[0]._7_1_ = (undefined1)((ulong)uVar1 >> 0x38);
  w15[0]._0_1_ = (undefined1)uVar2;
  w15[0]._1_1_ = (undefined1)((ulong)uVar2 >> 8);
  w15[0]._2_1_ = (undefined1)((ulong)uVar2 >> 0x10);
  w15[0]._3_1_ = (undefined1)((ulong)uVar2 >> 0x18);
  w15[0]._4_1_ = (undefined1)((ulong)uVar2 >> 0x20);
  w15[0]._5_1_ = (undefined1)((ulong)uVar2 >> 0x28);
  w15[0]._6_1_ = (undefined1)((ulong)uVar2 >> 0x30);
  w15[0]._7_1_ = (undefined1)((ulong)uVar2 >> 0x38);
  uVar1 = in_RDI[0x11];
  uVar2 = in_RDI[0x13];
  uStack_90 = (undefined1)uVar1;
  uStack_8f = (undefined1)((ulong)uVar1 >> 8);
  uStack_8e = (undefined1)((ulong)uVar1 >> 0x10);
  uStack_8d = (undefined1)((ulong)uVar1 >> 0x18);
  uStack_8c = (undefined1)((ulong)uVar1 >> 0x20);
  uStack_8b = (undefined1)((ulong)uVar1 >> 0x28);
  uStack_8a = (undefined1)((ulong)uVar1 >> 0x30);
  uStack_89 = (undefined1)((ulong)uVar1 >> 0x38);
  uStack_a0 = (undefined1)uVar2;
  uStack_9f = (undefined1)((ulong)uVar2 >> 8);
  uStack_9e = (undefined1)((ulong)uVar2 >> 0x10);
  uStack_9d = (undefined1)((ulong)uVar2 >> 0x18);
  uStack_9c = (undefined1)((ulong)uVar2 >> 0x20);
  uStack_9b = (undefined1)((ulong)uVar2 >> 0x28);
  uStack_9a = (undefined1)((ulong)uVar2 >> 0x30);
  uStack_99 = (undefined1)((ulong)uVar2 >> 0x38);
  uVar1 = in_RDI[0x15];
  uVar2 = in_RDI[0x17];
  uStack_b0 = (undefined1)uVar1;
  uStack_af = (undefined1)((ulong)uVar1 >> 8);
  uStack_ae = (undefined1)((ulong)uVar1 >> 0x10);
  uStack_ad = (undefined1)((ulong)uVar1 >> 0x18);
  uStack_ac = (undefined1)((ulong)uVar1 >> 0x20);
  uStack_ab = (undefined1)((ulong)uVar1 >> 0x28);
  uStack_aa = (undefined1)((ulong)uVar1 >> 0x30);
  uStack_a9 = (undefined1)((ulong)uVar1 >> 0x38);
  uStack_c0 = (undefined1)uVar2;
  uStack_bf = (undefined1)((ulong)uVar2 >> 8);
  uStack_be = (undefined1)((ulong)uVar2 >> 0x10);
  uStack_bd = (undefined1)((ulong)uVar2 >> 0x18);
  uStack_bc = (undefined1)((ulong)uVar2 >> 0x20);
  uStack_bb = (undefined1)((ulong)uVar2 >> 0x28);
  uStack_ba = (undefined1)((ulong)uVar2 >> 0x30);
  uStack_b9 = (undefined1)((ulong)uVar2 >> 0x38);
  uVar1 = in_RDI[0x19];
  uVar2 = in_RDI[0x1b];
  uStack_d0 = (undefined1)uVar1;
  uStack_cf = (undefined1)((ulong)uVar1 >> 8);
  uStack_ce = (undefined1)((ulong)uVar1 >> 0x10);
  uStack_cd = (undefined1)((ulong)uVar1 >> 0x18);
  uStack_cc = (undefined1)((ulong)uVar1 >> 0x20);
  uStack_cb = (undefined1)((ulong)uVar1 >> 0x28);
  uStack_ca = (undefined1)((ulong)uVar1 >> 0x30);
  uStack_c9 = (undefined1)((ulong)uVar1 >> 0x38);
  uStack_e0 = (undefined1)uVar2;
  uStack_df = (undefined1)((ulong)uVar2 >> 8);
  uStack_de = (undefined1)((ulong)uVar2 >> 0x10);
  uStack_dd = (undefined1)((ulong)uVar2 >> 0x18);
  uStack_dc = (undefined1)((ulong)uVar2 >> 0x20);
  uStack_db = (undefined1)((ulong)uVar2 >> 0x28);
  uStack_da = (undefined1)((ulong)uVar2 >> 0x30);
  uStack_d9 = (undefined1)((ulong)uVar2 >> 0x38);
  uVar1 = in_RDI[0x1d];
  uVar2 = in_RDI[0x1f];
  uStack_f0 = (undefined1)uVar1;
  uStack_ef = (undefined1)((ulong)uVar1 >> 8);
  uStack_ee = (undefined1)((ulong)uVar1 >> 0x10);
  uStack_ed = (undefined1)((ulong)uVar1 >> 0x18);
  uStack_ec = (undefined1)((ulong)uVar1 >> 0x20);
  uStack_eb = (undefined1)((ulong)uVar1 >> 0x28);
  uStack_ea = (undefined1)((ulong)uVar1 >> 0x30);
  uStack_e9 = (undefined1)((ulong)uVar1 >> 0x38);
  uStack_100 = (undefined1)uVar2;
  uStack_ff = (undefined1)((ulong)uVar2 >> 8);
  uStack_fe = (undefined1)((ulong)uVar2 >> 0x10);
  uStack_fd = (undefined1)((ulong)uVar2 >> 0x18);
  uStack_fc = (undefined1)((ulong)uVar2 >> 0x20);
  uStack_fb = (undefined1)((ulong)uVar2 >> 0x28);
  uStack_fa = (undefined1)((ulong)uVar2 >> 0x30);
  uStack_f9 = (undefined1)((ulong)uVar2 >> 0x38);
  in_RSI[0x80] = (undefined1)w8[0];
  in_RSI[0x81] = (undefined1)w9[0];
  in_RSI[0x82] = (undefined1)w10[0];
  in_RSI[0x83] = (undefined1)w11[0];
  in_RSI[0x84] = (undefined1)w12[0];
  in_RSI[0x85] = (undefined1)w13[0];
  in_RSI[0x86] = (undefined1)w14[0];
  in_RSI[0x87] = (undefined1)w15[0];
  in_RSI[0x88] = uStack_90;
  in_RSI[0x89] = uStack_a0;
  in_RSI[0x8a] = uStack_b0;
  in_RSI[0x8b] = uStack_c0;
  in_RSI[0x8c] = uStack_d0;
  in_RSI[0x8d] = uStack_e0;
  in_RSI[0x8e] = uStack_f0;
  in_RSI[0x8f] = uStack_100;
  in_RSI[0x90] = w8[0]._1_1_;
  in_RSI[0x91] = w9[0]._1_1_;
  in_RSI[0x92] = w10[0]._1_1_;
  in_RSI[0x93] = w11[0]._1_1_;
  in_RSI[0x94] = w12[0]._1_1_;
  in_RSI[0x95] = w13[0]._1_1_;
  in_RSI[0x96] = w14[0]._1_1_;
  in_RSI[0x97] = w15[0]._1_1_;
  in_RSI[0x98] = uStack_8f;
  in_RSI[0x99] = uStack_9f;
  in_RSI[0x9a] = uStack_af;
  in_RSI[0x9b] = uStack_bf;
  in_RSI[0x9c] = uStack_cf;
  in_RSI[0x9d] = uStack_df;
  in_RSI[0x9e] = uStack_ef;
  in_RSI[0x9f] = uStack_ff;
  in_RSI[0xa0] = w8[0]._2_1_;
  in_RSI[0xa1] = w9[0]._2_1_;
  in_RSI[0xa2] = w10[0]._2_1_;
  in_RSI[0xa3] = w11[0]._2_1_;
  in_RSI[0xa4] = w12[0]._2_1_;
  in_RSI[0xa5] = w13[0]._2_1_;
  in_RSI[0xa6] = w14[0]._2_1_;
  in_RSI[0xa7] = w15[0]._2_1_;
  in_RSI[0xa8] = uStack_8e;
  in_RSI[0xa9] = uStack_9e;
  in_RSI[0xaa] = uStack_ae;
  in_RSI[0xab] = uStack_be;
  in_RSI[0xac] = uStack_ce;
  in_RSI[0xad] = uStack_de;
  in_RSI[0xae] = uStack_ee;
  in_RSI[0xaf] = uStack_fe;
  in_RSI[0xb0] = w8[0]._3_1_;
  in_RSI[0xb1] = w9[0]._3_1_;
  in_RSI[0xb2] = w10[0]._3_1_;
  in_RSI[0xb3] = w11[0]._3_1_;
  in_RSI[0xb4] = w12[0]._3_1_;
  in_RSI[0xb5] = w13[0]._3_1_;
  in_RSI[0xb6] = w14[0]._3_1_;
  in_RSI[0xb7] = w15[0]._3_1_;
  in_RSI[0xb8] = uStack_8d;
  in_RSI[0xb9] = uStack_9d;
  in_RSI[0xba] = uStack_ad;
  in_RSI[0xbb] = uStack_bd;
  in_RSI[0xbc] = uStack_cd;
  in_RSI[0xbd] = uStack_dd;
  in_RSI[0xbe] = uStack_ed;
  in_RSI[0xbf] = uStack_fd;
  in_RSI[0xc0] = w8[0]._4_1_;
  in_RSI[0xc1] = w9[0]._4_1_;
  in_RSI[0xc2] = w10[0]._4_1_;
  in_RSI[0xc3] = w11[0]._4_1_;
  in_RSI[0xc4] = w12[0]._4_1_;
  in_RSI[0xc5] = w13[0]._4_1_;
  in_RSI[0xc6] = w14[0]._4_1_;
  in_RSI[199] = w15[0]._4_1_;
  in_RSI[200] = uStack_8c;
  in_RSI[0xc9] = uStack_9c;
  in_RSI[0xca] = uStack_ac;
  in_RSI[0xcb] = uStack_bc;
  in_RSI[0xcc] = uStack_cc;
  in_RSI[0xcd] = uStack_dc;
  in_RSI[0xce] = uStack_ec;
  in_RSI[0xcf] = uStack_fc;
  in_RSI[0xd0] = w8[0]._5_1_;
  in_RSI[0xd1] = w9[0]._5_1_;
  in_RSI[0xd2] = w10[0]._5_1_;
  in_RSI[0xd3] = w11[0]._5_1_;
  in_RSI[0xd4] = w12[0]._5_1_;
  in_RSI[0xd5] = w13[0]._5_1_;
  in_RSI[0xd6] = w14[0]._5_1_;
  in_RSI[0xd7] = w15[0]._5_1_;
  in_RSI[0xd8] = uStack_8b;
  in_RSI[0xd9] = uStack_9b;
  in_RSI[0xda] = uStack_ab;
  in_RSI[0xdb] = uStack_bb;
  in_RSI[0xdc] = uStack_cb;
  in_RSI[0xdd] = uStack_db;
  in_RSI[0xde] = uStack_eb;
  in_RSI[0xdf] = uStack_fb;
  in_RSI[0xe0] = w8[0]._6_1_;
  in_RSI[0xe1] = w9[0]._6_1_;
  in_RSI[0xe2] = w10[0]._6_1_;
  in_RSI[0xe3] = w11[0]._6_1_;
  in_RSI[0xe4] = w12[0]._6_1_;
  in_RSI[0xe5] = w13[0]._6_1_;
  in_RSI[0xe6] = w14[0]._6_1_;
  in_RSI[0xe7] = w15[0]._6_1_;
  in_RSI[0xe8] = uStack_8a;
  in_RSI[0xe9] = uStack_9a;
  in_RSI[0xea] = uStack_aa;
  in_RSI[0xeb] = uStack_ba;
  in_RSI[0xec] = uStack_ca;
  in_RSI[0xed] = uStack_da;
  in_RSI[0xee] = uStack_ea;
  in_RSI[0xef] = uStack_fa;
  in_RSI[0xf0] = w8[0]._7_1_;
  in_RSI[0xf1] = w9[0]._7_1_;
  in_RSI[0xf2] = w10[0]._7_1_;
  in_RSI[0xf3] = w11[0]._7_1_;
  in_RSI[0xf4] = w12[0]._7_1_;
  in_RSI[0xf5] = w13[0]._7_1_;
  in_RSI[0xf6] = w14[0]._7_1_;
  in_RSI[0xf7] = w15[0]._7_1_;
  in_RSI[0xf8] = uStack_89;
  in_RSI[0xf9] = uStack_99;
  in_RSI[0xfa] = uStack_a9;
  in_RSI[0xfb] = uStack_b9;
  in_RSI[0xfc] = uStack_c9;
  in_RSI[0xfd] = uStack_d9;
  in_RSI[0xfe] = uStack_e9;
  in_RSI[0xff] = uStack_f9;
  return;
}

Assistant:

static inline void transpose16x16_sse2(__m128i *x, __m128i *d) {
  __m128i w0, w1, w2, w3, w4, w5, w6, w7, w8, w9;
  __m128i w10, w11, w12, w13, w14, w15;

  w0 = _mm_unpacklo_epi8(x[0], x[1]);
  w1 = _mm_unpacklo_epi8(x[2], x[3]);
  w2 = _mm_unpacklo_epi8(x[4], x[5]);
  w3 = _mm_unpacklo_epi8(x[6], x[7]);

  w8 = _mm_unpacklo_epi8(x[8], x[9]);
  w9 = _mm_unpacklo_epi8(x[10], x[11]);
  w10 = _mm_unpacklo_epi8(x[12], x[13]);
  w11 = _mm_unpacklo_epi8(x[14], x[15]);

  w4 = _mm_unpacklo_epi16(w0, w1);
  w5 = _mm_unpacklo_epi16(w2, w3);
  w12 = _mm_unpacklo_epi16(w8, w9);
  w13 = _mm_unpacklo_epi16(w10, w11);

  w6 = _mm_unpacklo_epi32(w4, w5);
  w7 = _mm_unpackhi_epi32(w4, w5);
  w14 = _mm_unpacklo_epi32(w12, w13);
  w15 = _mm_unpackhi_epi32(w12, w13);

  // Store first 4-line result
  d[0] = _mm_unpacklo_epi64(w6, w14);
  d[1] = _mm_unpackhi_epi64(w6, w14);
  d[2] = _mm_unpacklo_epi64(w7, w15);
  d[3] = _mm_unpackhi_epi64(w7, w15);

  w4 = _mm_unpackhi_epi16(w0, w1);
  w5 = _mm_unpackhi_epi16(w2, w3);
  w12 = _mm_unpackhi_epi16(w8, w9);
  w13 = _mm_unpackhi_epi16(w10, w11);

  w6 = _mm_unpacklo_epi32(w4, w5);
  w7 = _mm_unpackhi_epi32(w4, w5);
  w14 = _mm_unpacklo_epi32(w12, w13);
  w15 = _mm_unpackhi_epi32(w12, w13);

  // Store second 4-line result
  d[4] = _mm_unpacklo_epi64(w6, w14);
  d[5] = _mm_unpackhi_epi64(w6, w14);
  d[6] = _mm_unpacklo_epi64(w7, w15);
  d[7] = _mm_unpackhi_epi64(w7, w15);

  // upper half
  w0 = _mm_unpackhi_epi8(x[0], x[1]);
  w1 = _mm_unpackhi_epi8(x[2], x[3]);
  w2 = _mm_unpackhi_epi8(x[4], x[5]);
  w3 = _mm_unpackhi_epi8(x[6], x[7]);

  w8 = _mm_unpackhi_epi8(x[8], x[9]);
  w9 = _mm_unpackhi_epi8(x[10], x[11]);
  w10 = _mm_unpackhi_epi8(x[12], x[13]);
  w11 = _mm_unpackhi_epi8(x[14], x[15]);

  w4 = _mm_unpacklo_epi16(w0, w1);
  w5 = _mm_unpacklo_epi16(w2, w3);
  w12 = _mm_unpacklo_epi16(w8, w9);
  w13 = _mm_unpacklo_epi16(w10, w11);

  w6 = _mm_unpacklo_epi32(w4, w5);
  w7 = _mm_unpackhi_epi32(w4, w5);
  w14 = _mm_unpacklo_epi32(w12, w13);
  w15 = _mm_unpackhi_epi32(w12, w13);

  // Store first 4-line result
  d[8] = _mm_unpacklo_epi64(w6, w14);
  d[9] = _mm_unpackhi_epi64(w6, w14);
  d[10] = _mm_unpacklo_epi64(w7, w15);
  d[11] = _mm_unpackhi_epi64(w7, w15);

  w4 = _mm_unpackhi_epi16(w0, w1);
  w5 = _mm_unpackhi_epi16(w2, w3);
  w12 = _mm_unpackhi_epi16(w8, w9);
  w13 = _mm_unpackhi_epi16(w10, w11);

  w6 = _mm_unpacklo_epi32(w4, w5);
  w7 = _mm_unpackhi_epi32(w4, w5);
  w14 = _mm_unpacklo_epi32(w12, w13);
  w15 = _mm_unpackhi_epi32(w12, w13);

  // Store second 4-line result
  d[12] = _mm_unpacklo_epi64(w6, w14);
  d[13] = _mm_unpackhi_epi64(w6, w14);
  d[14] = _mm_unpacklo_epi64(w7, w15);
  d[15] = _mm_unpackhi_epi64(w7, w15);
}